

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVector.cpp
# Opt level: O1

AlphaVector * __thiscall AlphaVector::operator=(AlphaVector *this,AlphaVector *o)

{
  if (this != o) {
    this->_m_action = o->_m_action;
    std::vector<double,_std::allocator<double>_>::operator=(&this->_m_values,&o->_m_values);
    this->_m_betaI = o->_m_betaI;
  }
  return this;
}

Assistant:

AlphaVector& AlphaVector::operator= (const AlphaVector& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...

    this->_m_action=o._m_action;
    this->_m_values=o._m_values;
    this->_m_betaI=o._m_betaI;

    return *this;
}